

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

bool __thiscall
ELFIO::elfio::write_segment_data
          (elfio *this,segment *seg,vector<bool,_std::allocator<bool>_> *section_generated,
          Elf_Xword *segment_memory,Elf_Xword *segment_filesize,Elf_Xword *seg_start_pos)

{
  Elf_Xword *pEVar1;
  elfio *peVar2;
  pointer puVar3;
  char cVar4;
  short sVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong __n;
  ulong uVar10;
  ulong uVar11;
  Elf_Half j;
  ushort uVar12;
  _Head_base<0UL,_ELFIO::section_*,_false> _Var13;
  reference rVar14;
  long local_38;
  
  pEVar1 = &this->current_file_pos;
  uVar12 = 0;
  while( true ) {
    iVar6 = (*seg->_vptr_segment[0x16])(seg);
    if ((ushort)iVar6 <= uVar12) break;
    uVar7 = (*seg->_vptr_segment[0x17])(seg,(ulong)uVar12);
    __n = (ulong)(uVar7 & 0xffff);
    peVar2 = (this->sections).parent;
    puVar3 = (peVar2->sections_).
             super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (__n < (ulong)((long)(peVar2->sections_).
                            super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)) {
      _Var13._M_head_impl =
           *(section **)
            &puVar3[__n]._M_t.
             super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>;
    }
    else {
      _Var13._M_head_impl = (section *)0x0;
    }
    iVar8 = (**(code **)(*(long *)_Var13._M_head_impl + 0x28))(_Var13._M_head_impl);
    rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](section_generated,__n);
    uVar11 = *rVar14._M_p;
    if (iVar8 == 0) {
      *rVar14._M_p = uVar11 | rVar14._M_mask;
    }
    else {
      if (((((rVar14._M_mask & uVar11) == 0) &&
           (cVar4 = (**(code **)(*(long *)_Var13._M_head_impl + 0x130))(_Var13._M_head_impl),
           cVar4 != '\0')) &&
          (iVar8 = (**(code **)(*(long *)_Var13._M_head_impl + 0x28))(_Var13._M_head_impl),
          iVar8 != 8)) &&
         ((iVar8 = (**(code **)(*(long *)_Var13._M_head_impl + 0x28))(_Var13._M_head_impl),
          iVar8 != 0 &&
          (lVar9 = (**(code **)(*(long *)_Var13._M_head_impl + 0x98))(_Var13._M_head_impl),
          lVar9 != 0)))) {
        lVar9 = (**(code **)(*(long *)_Var13._M_head_impl + 0x88))(_Var13._M_head_impl);
        iVar8 = (*seg->_vptr_segment[9])(seg);
        uVar10 = lVar9 - CONCAT44(extraout_var,iVar8);
        uVar11 = uVar10 - (*pEVar1 - *seg_start_pos);
        if (uVar10 < *pEVar1 - *seg_start_pos) break;
      }
      else {
        rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](section_generated,__n);
        if (((*rVar14._M_p & rVar14._M_mask) == 0) &&
           (cVar4 = (**(code **)(*(long *)_Var13._M_head_impl + 0x130))(_Var13._M_head_impl),
           cVar4 == '\0')) {
          lVar9 = (**(code **)(*(long *)_Var13._M_head_impl + 0x68))(_Var13._M_head_impl);
          uVar11 = lVar9 + (ulong)(lVar9 == 0);
          uVar11 = (uVar11 - *pEVar1 % uVar11) % uVar11;
        }
        else {
          rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](section_generated,__n);
          if ((*rVar14._M_p & rVar14._M_mask) == 0) {
            uVar11 = 0;
          }
          else {
            lVar9 = (**(code **)(*(long *)_Var13._M_head_impl + 0xb8))(_Var13._M_head_impl);
            uVar11 = lVar9 - (*seg_start_pos + *segment_filesize);
          }
        }
      }
      uVar10 = (**(code **)(*(long *)_Var13._M_head_impl + 0x38))(_Var13._M_head_impl);
      if (((uVar10 & 2) != 0) &&
         (((uVar7 = (**(code **)(*(long *)_Var13._M_head_impl + 0x38))(_Var13._M_head_impl),
           (uVar7 >> 10 & 1) == 0 || (iVar6 = (*seg->_vptr_segment[3])(seg), iVar6 == 7)) ||
          (iVar6 = (**(code **)(*(long *)_Var13._M_head_impl + 0x28))(_Var13._M_head_impl),
          iVar6 != 8)))) {
        lVar9 = (**(code **)(*(long *)_Var13._M_head_impl + 0x98))(_Var13._M_head_impl);
        *segment_memory = *segment_memory + lVar9 + uVar11;
      }
      iVar6 = (**(code **)(*(long *)_Var13._M_head_impl + 0x28))(_Var13._M_head_impl);
      if (iVar6 != 8) {
        lVar9 = (**(code **)(*(long *)_Var13._M_head_impl + 0x98))(_Var13._M_head_impl);
        *segment_filesize = *segment_filesize + lVar9 + uVar11;
      }
      rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](section_generated,__n);
      if ((*rVar14._M_p & rVar14._M_mask) == 0) {
        *pEVar1 = *pEVar1 + uVar11;
        cVar4 = (**(code **)(*(long *)_Var13._M_head_impl + 0x130))(_Var13._M_head_impl);
        if (cVar4 == '\0') {
          iVar6 = (*seg->_vptr_segment[9])(seg);
          local_38 = (CONCAT44(extraout_var_00,iVar6) + *pEVar1) - *seg_start_pos;
          (**(code **)(*(long *)_Var13._M_head_impl + 0x90))(_Var13._M_head_impl,&local_38);
        }
        sVar5 = (**(code **)(*(long *)_Var13._M_head_impl + 0x10))(_Var13._M_head_impl);
        if (sVar5 != 0) {
          (**(code **)(*(long *)_Var13._M_head_impl + 0x110))(_Var13._M_head_impl,pEVar1);
        }
        iVar6 = (**(code **)(*(long *)_Var13._M_head_impl + 0x28))(_Var13._M_head_impl);
        if (iVar6 != 8) {
          lVar9 = (**(code **)(*(long *)_Var13._M_head_impl + 0x98))(_Var13._M_head_impl);
          *pEVar1 = *pEVar1 + lVar9;
        }
        rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[](section_generated,__n);
        *rVar14._M_p = *rVar14._M_p | rVar14._M_mask;
      }
    }
    uVar12 = uVar12 + 1;
  }
  return (ushort)iVar6 <= uVar12;
}

Assistant:

bool write_segment_data( const segment*     seg,
                             std::vector<bool>& section_generated,
                             Elf_Xword&         segment_memory,
                             Elf_Xword&         segment_filesize,
                             const Elf_Xword&   seg_start_pos )
    {
        for ( Elf_Half j = 0; j < seg->get_sections_num(); ++j ) {
            Elf_Half index = seg->get_section_index_at( j );

            section* sec = sections[index];

            // The NULL section is always generated
            if ( SHT_NULL == sec->get_type() ) {
                section_generated[index] = true;
                continue;
            }

            Elf_Xword section_align = 0;
            // Fix up the alignment
            if ( !section_generated[index] && sec->is_address_initialized() &&
                 SHT_NOBITS != sec->get_type() && SHT_NULL != sec->get_type() &&
                 0 != sec->get_size() ) {
                // Align the sections based on the virtual addresses
                // when possible (this is what matters for execution)
                Elf64_Off req_offset =
                    sec->get_address() - seg->get_virtual_address();
                Elf64_Off cur_offset = current_file_pos - seg_start_pos;
                if ( req_offset < cur_offset ) {
                    // something has gone awfully wrong, abort!
                    // section_align would turn out negative, seeking backwards and overwriting previous data
                    return false;
                }
                section_align = req_offset - cur_offset;
            }
            else if ( !section_generated[index] &&
                      !sec->is_address_initialized() ) {
                // If no address has been specified then only the section
                // alignment constraint has to be matched
                Elf_Xword align = sec->get_addr_align();
                if ( align == 0 ) {
                    align = 1;
                }
                Elf64_Off error = current_file_pos % align;
                section_align   = ( align - error ) % align;
            }
            else if ( section_generated[index] ) {
                // Alignment for already generated sections
                section_align =
                    sec->get_offset() - seg_start_pos - segment_filesize;
            }

            // Determine the segment file and memory sizes
            // Special case .tbss section (NOBITS) in non TLS segment
            if ( ( ( sec->get_flags() & SHF_ALLOC ) == SHF_ALLOC ) &&
                 !( ( ( sec->get_flags() & SHF_TLS ) == SHF_TLS ) &&
                    ( seg->get_type() != PT_TLS ) &&
                    ( SHT_NOBITS == sec->get_type() ) ) ) {
                segment_memory += sec->get_size() + section_align;
            }

            if ( SHT_NOBITS != sec->get_type() ) {
                segment_filesize += sec->get_size() + section_align;
            }

            // Nothing to be done when generating nested segments
            if ( section_generated[index] ) {
                continue;
            }

            current_file_pos += section_align;

            // Set the section addresses when missing
            if ( !sec->is_address_initialized() ) {
                sec->set_address( seg->get_virtual_address() +
                                  current_file_pos - seg_start_pos );
            }

            if ( 0 != sec->get_index() ) {
                sec->set_offset( current_file_pos );
            }

            if ( SHT_NOBITS != sec->get_type() ) {
                current_file_pos += sec->get_size();
            }

            section_generated[index] = true;
        }

        return true;
    }